

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O3

int http_write_end(HTTP_INFO *hi)

{
  int iVar1;
  int len;
  char str [10];
  char local_24 [4];
  ushort local_20;
  
  len = -1;
  if (hi != (HTTP_INFO *)0x0) {
    if ((hi->request).chunked == '\x01') {
      local_20 = 10;
      builtin_strncpy(local_24,"0\r\n\r",4);
      len = 5;
    }
    else {
      local_20 = local_20 & 0xff00;
      builtin_strncpy(local_24,"\r\n\r\n",4);
      len = 4;
    }
    iVar1 = https_write(hi,local_24,len);
    if (iVar1 != len) {
      https_close(hi);
      len = -1;
      _error = iVar1;
    }
  }
  return len;
}

Assistant:

int http_write_end(HTTP_INFO *hi)
{
    char        str[10];
    int         ret, len;

    if (NULL == hi) return -1;

    if(hi->request.chunked == TRUE)
    {
        len = snprintf(str, 10, "0\r\n\r\n");
    }
    else
    {
        len = snprintf(str, 10, "\r\n\r\n");
    }

    if ((ret = https_write(hi, str, len)) != len)
    {
        https_close(hi);
        _error = ret;

        return -1;
    }

    return len;
}